

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DatatypeValidator::getWSstring(DatatypeValidator *this,short theType)

{
  short theType_local;
  DatatypeValidator *this_local;
  
  if (theType == 0) {
    this_local = (DatatypeValidator *)SchemaSymbols::fgWS_PRESERVE;
  }
  else if (theType == 1) {
    this_local = (DatatypeValidator *)SchemaSymbols::fgWS_REPLACE;
  }
  else if (theType == 2) {
    this_local = (DatatypeValidator *)SchemaSymbols::fgWS_COLLAPSE;
  }
  else {
    this_local = (DatatypeValidator *)SchemaSymbols::fgWS_PRESERVE;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* DatatypeValidator::getWSstring(const short theType) const
{
    switch (theType)
    {
    case PRESERVE:
         return SchemaSymbols::fgWS_PRESERVE;
    case REPLACE:
         return SchemaSymbols::fgWS_REPLACE;
    case COLLAPSE:
         return SchemaSymbols::fgWS_COLLAPSE;
    default:
         return SchemaSymbols::fgWS_PRESERVE;
    }

}